

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

int __thiscall ON_RevSurface::Degree(ON_RevSurface *this,int dir)

{
  int local_18;
  int local_14;
  int span_degree;
  int dir_local;
  ON_RevSurface *this_local;
  
  local_18 = 0;
  local_14 = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    local_14 = 1 - dir;
  }
  if (local_14 == 0) {
    local_18 = 2;
  }
  else if ((local_14 == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    local_18 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2c])();
  }
  return local_18;
}

Assistant:

int ON_RevSurface::Degree( int dir ) const
{
  int span_degree = 0;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0  )
    span_degree = 2;
  else if ( dir == 1 && m_curve )
    span_degree = m_curve->Degree();
  return span_degree;
}